

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
TasGrid::Optimizer::evalLagrange
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *nodes,
          vector<double,_std::allocator<double>_> *coeffs,double x)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  size_type __n;
  long lVar8;
  long lVar9;
  double dVar10;
  allocator_type local_29;
  double local_28;
  
  __n = (long)(nodes->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(nodes->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3;
  local_28 = x;
  ::std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_29);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar1 = 1.0;
  iVar5 = (int)__n;
  uVar6 = iVar5 - 1;
  if (1 < iVar5) {
    pdVar2 = (nodes->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = *pdVar1;
    uVar7 = 0;
    do {
      dVar10 = dVar10 * (local_28 - pdVar2[uVar7]);
      pdVar1[uVar7 + 1] = dVar10;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  pdVar2 = (coeffs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1[(int)uVar6] = pdVar1[(int)uVar6] / pdVar2[(int)uVar6];
  if (1 < iVar5) {
    pdVar3 = (nodes->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = 1.0;
    lVar8 = (ulong)(iVar5 - 2) + 1;
    do {
      dVar10 = dVar10 * (local_28 - pdVar3[lVar8]);
      pdVar1[lVar8 + -1] = (dVar10 / pdVar2[lVar8 + -1]) * pdVar1[lVar8 + -1];
      lVar9 = lVar8 + -1;
      bVar4 = 0 < lVar8;
      lVar8 = lVar9;
    } while (lVar9 != 0 && bVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> evalLagrange(std::vector<double> const &nodes, std::vector<double> const &coeffs, double x){
    int num_nodes = (int) nodes.size();
    std::vector<double> lag(nodes.size());
    lag[0] = 1.0;
    for(int i=0; i<num_nodes-1; i++){
        lag[i+1] = (x - nodes[i]) * lag[i];
    }
    double w = 1.0;
    lag[num_nodes-1] /= coeffs[num_nodes-1];
    for(int i= num_nodes-2; i>=0; i--){
        w *= (x - nodes[i+1]);
        lag[i] *= w / coeffs[i];
    }
    return lag;
}